

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O3

void __thiscall
OpenMD::ForceMatrixDecomposition::~ForceMatrixDecomposition(ForceMatrixDecomposition *this)

{
  pointer piVar1;
  pointer pdVar2;
  
  (this->super_ForceDecomposition)._vptr_ForceDecomposition =
       (_func_int **)&PTR__ForceMatrixDecomposition_00302d60;
  piVar1 = (this->groupToGtype).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->groupToGtype).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  pdVar2 = (this->groupCutoff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->groupCutoff).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  piVar1 = (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->cgLocalToGlobal).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  piVar1 = (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->AtomLocalToGlobal).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  ForceDecomposition::~ForceDecomposition(&this->super_ForceDecomposition);
  return;
}

Assistant:

ForceMatrixDecomposition::~ForceMatrixDecomposition() {
#ifdef IS_MPI
    delete AtomPlanIntRow;
    delete AtomPlanRealRow;
    delete AtomPlanVectorRow;
    delete AtomPlanMatrixRow;
    delete AtomPlanPotRow;
    delete AtomPlanIntColumn;
    delete AtomPlanRealColumn;
    delete AtomPlanVectorColumn;
    delete AtomPlanMatrixColumn;
    delete AtomPlanPotColumn;
    delete cgPlanIntRow;
    delete cgPlanVectorRow;
    delete cgPlanIntColumn;
    delete cgPlanVectorColumn;
#endif
  }